

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdcat.c
# Opt level: O2

void bsdcat_read_to_stdout(char *filename)

{
  wchar_t wVar1;
  uint uVar2;
  int iVar3;
  
  wVar1 = archive_read_open_filename(a,filename,0x2800);
  if (wVar1 == L'\0') {
    uVar2 = archive_read_next_header(a,&ae);
    if (uVar2 < 2) {
      if (uVar2 == 1) goto LAB_00102709;
      iVar3 = archive_read_data_into_fd(a,1);
      if (iVar3 == 0) goto LAB_00102709;
    }
  }
  bsdcat_print_error();
LAB_00102709:
  iVar3 = archive_read_close(a);
  if (iVar3 != 0) {
    bsdcat_print_error();
  }
  archive_read_free(a);
  a = (archive *)0x0;
  return;
}

Assistant:

static void
bsdcat_read_to_stdout(const char* filename)
{
	int r;

	if (archive_read_open_filename(a, filename, BYTES_PER_BLOCK)
	    != ARCHIVE_OK)
		bsdcat_print_error();
	else if (r = archive_read_next_header(a, &ae),
		 r != ARCHIVE_OK && r != ARCHIVE_EOF)
		bsdcat_print_error();
	else if (r == ARCHIVE_EOF)
		/* for empty payloads don't try and read data */
		;
	else if (archive_read_data_into_fd(a, 1) != ARCHIVE_OK)
		bsdcat_print_error();
	if (archive_read_close(a) != ARCHIVE_OK)
		bsdcat_print_error();
	archive_read_free(a);
	a = NULL;
}